

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O1

void avalues(double *w,int N,int p,int q,double *phi,double *theta,int s,int ps,int qs,double *phis,
            double *thetas,int tval,double *a)

{
  int iVar1;
  void *__s;
  void *__s_00;
  long lVar2;
  void *__s_01;
  void *__ptr;
  ulong uVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  void *pvVar11;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  int iVar18;
  double *pdVar19;
  uint uVar20;
  double dVar21;
  int local_40;
  
  __s = malloc((long)N * 8);
  __s_00 = malloc((long)tval << 3);
  uVar20 = q;
  if (q < p) {
    uVar20 = p;
  }
  if ((int)uVar20 <= ps) {
    uVar20 = ps;
  }
  if ((int)uVar20 <= qs) {
    uVar20 = qs;
  }
  iVar1 = tval + N;
  iVar6 = iVar1 + uVar20;
  lVar2 = (long)iVar6;
  __s_01 = malloc(lVar2 * 8);
  __ptr = malloc(lVar2 * 8);
  if (0 < N) {
    memset(__s,0,(ulong)(uint)N << 3);
  }
  if (0 < iVar6) {
    memset(__s_01,0,(ulong)((uVar20 + iVar1) - 1) * 8 + 8);
  }
  uVar7 = (ulong)(uint)p;
  if (1 < iVar1) {
    memset(a,0,(ulong)(iVar1 - 1) << 3);
  }
  if (0 < tval) {
    memset(__s_00,0,(ulong)(uint)tval * 8);
  }
  uVar3 = (ulong)(uint)q;
  if (-1 < (int)(~uVar20 + N)) {
    uVar15 = (ulong)(~uVar20 + N);
    pdVar13 = w + uVar15 + 1;
    lVar10 = (long)__s + uVar15 * 8 + 8;
    do {
      dVar21 = 0.0;
      if (0 < p) {
        uVar14 = 0;
        do {
          dVar21 = dVar21 - phi[uVar14] * pdVar13[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar7 != uVar14);
      }
      if (0 < q) {
        uVar14 = 0;
        do {
          dVar21 = dVar21 + theta[uVar14] * *(double *)(lVar10 + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar3 != uVar14);
      }
      *(double *)((long)__s + uVar15 * 8) = dVar21 + w[uVar15];
      pdVar13 = pdVar13 + -1;
      lVar10 = lVar10 + -8;
      iVar9 = (int)uVar15;
      uVar15 = uVar15 - 1;
    } while (0 < iVar9);
  }
  if (0 < tval) {
    pdVar5 = (double *)((long)__s_00 + -8);
    lVar10 = 0;
    uVar15 = 0;
    pvVar11 = __s;
    pdVar13 = w;
    do {
      dVar21 = 0.0;
      if (0 < p) {
        uVar14 = 0;
        pdVar16 = pdVar5;
        pdVar17 = pdVar13;
        do {
          pdVar19 = pdVar17;
          if ((long)(lVar10 + uVar14) < 0) {
            pdVar19 = pdVar16;
          }
          dVar21 = dVar21 - phi[uVar14] * *pdVar19;
          uVar14 = uVar14 + 1;
          pdVar17 = pdVar17 + 1;
          pdVar16 = pdVar16 + -1;
        } while (uVar7 != uVar14);
      }
      if (0 < q) {
        uVar14 = 0;
        do {
          if (-1 < (long)(lVar10 + uVar14)) {
            dVar21 = dVar21 + theta[uVar14] * *(double *)((long)pvVar11 + uVar14 * 8);
          }
          uVar14 = uVar14 + 1;
        } while (uVar3 != uVar14);
      }
      *(double *)((long)__s_00 + uVar15 * 8) = -dVar21;
      uVar15 = uVar15 + 1;
      pdVar13 = pdVar13 + -1;
      lVar10 = lVar10 + -1;
      pdVar5 = pdVar5 + 1;
      pvVar11 = (void *)((long)pvVar11 + -8);
    } while (uVar15 != (uint)tval);
  }
  uVar15 = (ulong)uVar20;
  if (0 < iVar1) {
    local_40 = ps;
    if (ps < qs) {
      local_40 = qs;
    }
    iVar9 = uVar20 + tval;
    if (local_40 <= q) {
      local_40 = q;
    }
    if (local_40 <= p) {
      local_40 = p;
    }
    uVar15 = (ulong)local_40;
    iVar4 = iVar9 - local_40;
    local_40 = local_40 + -1;
    do {
      if (p < 1) {
        dVar21 = 0.0;
      }
      else {
        dVar21 = 0.0;
        lVar10 = 0;
        iVar18 = local_40;
        do {
          if (iVar18 < iVar9) {
            if ((int)uVar20 <= iVar18) {
              pdVar13 = (double *)((long)__s_00 + lVar10 + (long)iVar4 * 8);
              goto LAB_00135637;
            }
          }
          else {
            pdVar13 = w + (iVar18 - iVar9);
LAB_00135637:
            dVar21 = dVar21 - *(double *)((long)phi + lVar10) * *pdVar13;
          }
          lVar10 = lVar10 + 8;
          iVar18 = iVar18 + -1;
        } while (uVar7 * 8 - lVar10 != 0);
      }
      if (0 < q) {
        uVar14 = 0;
        iVar18 = local_40;
        do {
          if ((int)uVar20 <= iVar18) {
            dVar21 = dVar21 + theta[uVar14] * *(double *)((long)__s_01 + (long)iVar18 * 8);
          }
          uVar14 = uVar14 + 1;
          iVar18 = iVar18 + -1;
        } while (uVar3 != uVar14);
      }
      if ((long)uVar15 < (long)iVar9) {
        if ((long)(int)uVar20 <= (long)uVar15) {
          iVar18 = iVar9 - (int)uVar15;
          pdVar13 = (double *)((long)__s_00 + -8);
          goto LAB_001356ba;
        }
      }
      else {
        iVar18 = (int)uVar15 - iVar9;
        pdVar13 = w;
LAB_001356ba:
        *(double *)((long)__s_01 + uVar15 * 8) = dVar21 + pdVar13[iVar18];
      }
      uVar15 = uVar15 + 1;
      iVar4 = iVar4 + -1;
      local_40 = local_40 + 1;
    } while ((long)uVar15 < lVar2);
  }
  if (0 < iVar6) {
    *(undefined8 *)((long)__ptr + (long)(int)uVar15 * 8) = 0;
  }
  if (0 < iVar1) {
    if (ps < qs) {
      ps = qs;
    }
    if (ps <= q) {
      ps = q;
    }
    lVar10 = (long)s;
    if (ps <= p) {
      ps = p;
    }
    lVar8 = (long)ps;
    lVar12 = lVar8 * 8 + lVar10 * -8;
    pdVar5 = (double *)((long)__s_01 + lVar12);
    pdVar13 = (double *)(lVar12 + (long)__ptr);
    do {
      dVar21 = 0.0;
      if (0 < p) {
        uVar15 = 0;
        pdVar16 = pdVar5;
        do {
          pdVar17 = phis + uVar15;
          uVar15 = uVar15 + 1;
          dVar21 = dVar21 - *pdVar17 * *pdVar16;
          pdVar16 = pdVar16 + -lVar10;
        } while (uVar7 != uVar15);
      }
      if (0 < q) {
        uVar15 = 0;
        pdVar16 = pdVar13;
        do {
          pdVar17 = thetas + uVar15;
          uVar15 = uVar15 + 1;
          dVar21 = dVar21 + *pdVar17 * *pdVar16;
          pdVar16 = pdVar16 + -lVar10;
        } while (uVar3 != uVar15);
      }
      *(double *)((long)__ptr + lVar8 * 8) = dVar21 + *(double *)((long)__s_01 + lVar8 * 8);
      lVar8 = lVar8 + 1;
      pdVar5 = pdVar5 + 1;
      pdVar13 = pdVar13 + 1;
    } while (lVar8 < lVar2);
  }
  if (1 < iVar1) {
    lVar10 = 0;
    do {
      a[(int)lVar10] = *(double *)((long)__ptr + lVar10 * 8 + (long)(int)(uVar20 + 1) * 8);
      lVar8 = (int)(uVar20 + 1) + lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar8 + 1 < lVar2);
  }
  free(__s);
  free(__s_00);
  free(__s_01);
  free(__ptr);
  return;
}

Assistant:

void avalues(double *w,int N,int p, int q, double *phi,double *theta,int s,int ps,int qs,
		double *phis, double *thetas,int tval,double *a) {

	int k,i,t,t2,newl,iter;
	double temp;
	double *e,*w2,*alpha,*alpha2;


	e = (double*) malloc(sizeof(double) * N);
	w2 = (double*) malloc(sizeof(double) * tval);

	if (p > q) {
		k = p;
	} else {
		k = q;
	}

	if ( k < ps) {
		k = ps;
	}

	if (k < qs) {
		k = qs;
	}

	alpha = (double*) malloc(sizeof(double) * (tval+N+k));
	alpha2 = (double*) malloc(sizeof(double) * (tval+N+k));

	for(i = 0; i < N;++i) {
		e[i] = 0.0;
	}

	for(i = 0; i < N+tval+k;++i) {
		alpha[i] = 0.0;
	}

	for(i = 0; i < N+tval-1;++i) {
		a[i] = 0.0;
	}

	for(i = 0; i < tval;++i) {
		w2[i] = 0.0;
	}

	for(i = N-k-1; i >= 0; --i) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phi[t] * w[i+t+1];
		}

		for ( t2 = 0; t2 < q;++t2) {
			temp = temp + theta[t2] * e[t2+i+1];
		}

		e[i] = w[i] + temp;
	}

	for(i = 0; i < tval;++i) {
		temp = 0.0;
		for(t = 0; t < p;++t) {
			if (t-i < 0) {
				temp = temp - phi[t]*w2[i-t-1];
			} else {
				temp = temp - phi[t]*w[t-i];
			}
			//printf("temp %g \n",temp);

		}

		for(t2 = 0; t2 < q;++t2) {
			if (t2-i >= 0) {
				temp=temp+theta[t2]*e[t2-i];
			}
		}
		w2[i] = -temp;
	}

	newl = N + tval;


	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;
		for (t = 0; t < p;++t) {
			if (iter-t-1 >= tval+k ) {
				temp = temp - phi[t] * w[iter-t-1-tval-k];
			} else if (iter-t-1 < tval+k && iter-t-1 >= k) {
				temp = temp - phi[t] * w2[k-iter+tval+t];
			}
		}

		for (t2 = 0; t2 < q; ++t2) {
			if (iter-t2-1 >= k ) {
				temp = temp + theta[t2] * alpha[iter-t2-1];
			}
		}

		//printf("%g \n",temp);

		if (iter >= tval+k) {
			alpha[iter] = w[iter-tval-k] + temp;
		} else if (iter >= k){
			alpha[iter] = w2[k-iter+tval-1] + temp;
		}
	}
/*
	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha[iter];
	}
*/
	for(i = 0; i < newl+k;++i) {
		alpha2[iter] = 0.0;
	}

	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phis[t] * alpha[iter - (t+1) * s];
		}

		for (t2 = 0; t2 < q; ++t2) {
			temp = temp + thetas[t2] * alpha2[iter-(t2+1)*s];
		}

		alpha2[iter] = alpha[iter] + temp;

	}

	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha2[iter];
	}


	free(e);
	free(w2);
	free(alpha);
	free(alpha2);

}